

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SummaryTest_quantile_values_Test::TestBody
          (SummaryTest_quantile_values_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_2a0;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_3;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_2;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_238;
  Message local_230;
  uint local_224;
  size_type local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar;
  Summary s;
  ClientMetric metric;
  int i;
  milliseconds local_140;
  allocator<prometheus::detail::CKMSQuantiles::Quantile> local_121;
  Quantile local_120;
  Quantile local_100;
  Quantile local_e0;
  Quantile *local_c0;
  size_type local_b8;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_b0;
  undefined1 local_98 [8];
  Summary summary;
  SummaryTest_quantile_values_Test *this_local;
  
  summary.quantile_values_.rotation_interval_.__r = (rep)this;
  detail::CKMSQuantiles::Quantile::Quantile(&local_120,0.5,0.05);
  detail::CKMSQuantiles::Quantile::Quantile(&local_100,0.9,0.01);
  detail::CKMSQuantiles::Quantile::Quantile(&local_e0,0.99,0.001);
  local_b8 = 3;
  local_c0 = &local_120;
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::allocator(&local_121);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&local_b0,__l,&local_121);
  metric.timestamp_ms._4_4_ = 1;
  std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
            ((duration<long,std::ratio<3600l,1l>> *)&i,(int *)((long)&metric.timestamp_ms + 4));
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_140,
             (duration<long,_std::ratio<3600L,_1L>_> *)&i);
  Summary::Summary((Summary *)local_98,&local_b0,local_140,5);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~vector(&local_b0);
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::~allocator(&local_121);
  for (metric.timestamp_ms._0_4_ = 1; (int)metric.timestamp_ms < 0x186a1;
      metric.timestamp_ms._0_4_ = (int)metric.timestamp_ms + 1) {
    Summary::Observe((Summary *)local_98,(double)(int)metric.timestamp_ms);
  }
  Summary::Collect((ClientMetric *)
                   &s.quantile.
                    super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Summary *)local_98);
  ClientMetric::Summary::Summary((Summary *)&gtest_ar.message_,(Summary *)&metric.info);
  local_220 = std::
              vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ::size((vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                      *)&s.sample_sum);
  local_224 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_218,"s.quantile.size()","3U",&local_220,&local_224);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pvVar3 = std::
             vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
             ::at((vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                   *)&s.sample_sum,0);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_250,"s.quantile.at(0).value","0.5 * SAMPLES","0.05 * SAMPLES",
               pvVar3->value,50000.0,5000.0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
                 ,0x45,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    pvVar3 = std::
             vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
             ::at((vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                   *)&s.sample_sum,1);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_270,"s.quantile.at(1).value","0.9 * SAMPLES","0.01 * SAMPLES",
               pvVar3->value,90000.0,1000.0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
                 ,0x46,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_278);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    pvVar3 = std::
             vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
             ::at((vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                   *)&s.sample_sum,2);
    testing::internal::DoubleNearPredFormat
              ((internal *)local_290,"s.quantile.at(2).value","0.99 * SAMPLES","0.001 * SAMPLES",
               pvVar3->value,99000.0,100.0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
    if (!bVar1) {
      testing::Message::Message(&local_298);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
                 ,0x47,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      testing::Message::~Message(&local_298);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  ClientMetric::Summary::~Summary((Summary *)&gtest_ar.message_);
  ClientMetric::~ClientMetric
            ((ClientMetric *)
             &s.quantile.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Summary::~Summary((Summary *)local_98);
  return;
}

Assistant:

TEST(SummaryTest, quantile_values) {
  static const int SAMPLES = 100000;

  Summary summary{Summary::Quantiles{{0.5, 0.05}, {0.9, 0.01}, {0.99, 0.001}},
                  std::chrono::hours{1}};  // prevent rotation on slow CPUs
  for (int i = 1; i <= SAMPLES; ++i) summary.Observe(i);

  auto metric = summary.Collect();
  auto s = metric.summary;
  ASSERT_EQ(s.quantile.size(), 3U);

  EXPECT_NEAR(s.quantile.at(0).value, 0.5 * SAMPLES, 0.05 * SAMPLES);
  EXPECT_NEAR(s.quantile.at(1).value, 0.9 * SAMPLES, 0.01 * SAMPLES);
  EXPECT_NEAR(s.quantile.at(2).value, 0.99 * SAMPLES, 0.001 * SAMPLES);
}